

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generator.hpp
# Opt level: O2

uuid __thiscall
boost::uuids::
basic_random_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_>
::operator()(basic_random_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_>
             *this)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  uuid uVar4;
  uuid u;
  undefined6 local_20;
  undefined1 uStack_1a;
  undefined1 uStack_19;
  byte local_18;
  undefined7 uStack_17;
  undefined1 auVar5 [15];
  
  uVar1 = random::
          variate_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_*,_boost::uniform_int<unsigned_long>_>
          ::operator()(&this->generator);
  iVar2 = 0;
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    if (iVar2 == 8) {
      uVar1 = random::
              variate_generator<boost::random::mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>_*,_boost::uniform_int<unsigned_long>_>
              ::operator()(&this->generator);
      iVar2 = 0;
    }
    *(char *)((long)&local_20 + lVar3) = (char)(uVar1 >> ((char)iVar2 * '\b' & 0x3fU));
    iVar2 = iVar2 + 1;
  }
  uVar1 = CONCAT17(uStack_19,CONCAT16(uStack_1a,local_20)) & 0xff0fffffffffffff | 0x40000000000000;
  uVar4.data[0] = (char)uVar1;
  auVar5[1] = (char)(uVar1 >> 8);
  auVar5[2] = (char)(uVar1 >> 0x10);
  auVar5[3] = (char)(uVar1 >> 0x18);
  auVar5[4] = (char)(uVar1 >> 0x20);
  auVar5[5] = (char)(uVar1 >> 0x28);
  auVar5[6] = (char)(uVar1 >> 0x30);
  auVar5[7] = (char)(uVar1 >> 0x38);
  uVar4.data[8] = local_18 & 0x3f | 0x80;
  uVar4.data[9] = (undefined1)uStack_17;
  uVar4.data[10] = uStack_17._1_1_;
  uVar4.data[0xb] = uStack_17._2_1_;
  uVar4.data[0xc] = uStack_17._3_1_;
  uVar4.data[0xd] = uStack_17._4_1_;
  uVar4.data[0xe] = uStack_17._5_1_;
  uVar4.data[0xf] = uStack_17._6_1_;
  return (uuid)uVar4.data;
}

Assistant:

uuid operator()()
    {
        uuid u;

        int i=0;
        unsigned long random_value = generator();
        for (uuid::iterator it=u.begin(); it!=u.end(); ++it, ++i) {
            if (i==sizeof(unsigned long)) {
                random_value = generator();
                i = 0;
            }

            // static_cast gets rid of warnings of converting unsigned long to boost::uint8_t
            *it = static_cast<uuid::value_type>((random_value >> (i*8)) & 0xFF);
        }

        // set variant
        // must be 0b10xxxxxx
        *(u.begin()+8) &= 0xBF;
        *(u.begin()+8) |= 0x80;

        // set version
        // must be 0b0100xxxx
        *(u.begin()+6) &= 0x4F; //0b01001111
        *(u.begin()+6) |= 0x40; //0b01000000

        return u;
    }